

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filepath_tests.cpp
# Opt level: O0

void __thiscall
test::iu_FilePath_x_iutest_x_GetExtention_Test::Body(iu_FilePath_x_iutest_x_GetExtention_Test *this)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertionHelper local_680;
  Fixed local_650;
  string local_4c8;
  undefined1 local_4a8 [8];
  AssertionResult iutest_ar_2;
  FilePath path_2;
  Fixed local_430;
  string local_2a8;
  undefined1 local_288 [8];
  AssertionResult iutest_ar_1;
  FilePath path_1;
  Fixed local_210;
  string local_88;
  undefined1 local_68 [8];
  AssertionResult iutest_ar;
  undefined1 local_30 [8];
  FilePath path;
  iu_FilePath_x_iutest_x_GetExtention_Test *this_local;
  
  path.m_path.field_2._8_8_ = this;
  iutest::detail::iuFilePath::iuFilePath((iuFilePath *)local_30);
  iutest::detail::AlwaysZero();
  iutest::detail::iuFilePath::GetExtension_abi_cxx11_(&local_88,(iuFilePath *)local_30);
  iutest::internal::backward::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((AssertionResult *)local_68,(EqHelper<false> *)"\"\"","path.GetExtension()","",
             (char (*) [1])&local_88,in_R9);
  std::__cxx11::string::~string((string *)&local_88);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    memset(&local_210,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_210);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_68);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)((long)&path_1.m_path.field_2 + 8),
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0x97,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)((long)&path_1.m_path.field_2 + 8),&local_210);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)((long)&path_1.m_path.field_2 + 8))
    ;
    iutest::AssertionHelper::Fixed::~Fixed(&local_210);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  iutest::detail::iuFilePath::~iuFilePath((iuFilePath *)local_30);
  iutest::detail::iuFilePath::iuFilePath((iuFilePath *)&iutest_ar_1.m_result,"test.exe");
  iutest::detail::AlwaysZero();
  iutest::detail::iuFilePath::GetExtension_abi_cxx11_
            (&local_2a8,(iuFilePath *)&iutest_ar_1.m_result);
  iutest::internal::backward::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((AssertionResult *)local_288,(EqHelper<false> *)"\".exe\"","path.GetExtension()",".exe"
             ,(char (*) [5])&local_2a8,in_R9);
  std::__cxx11::string::~string((string *)&local_2a8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    memset(&local_430,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_430);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_288);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)((long)&path_2.m_path.field_2 + 8),
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0x9b,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)((long)&path_2.m_path.field_2 + 8),&local_430);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)((long)&path_2.m_path.field_2 + 8))
    ;
    iutest::AssertionHelper::Fixed::~Fixed(&local_430);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  iutest::detail::iuFilePath::~iuFilePath((iuFilePath *)&iutest_ar_1.m_result);
  iutest::detail::iuFilePath::iuFilePath((iuFilePath *)&iutest_ar_2.m_result,"test.exe.txt");
  iutest::detail::AlwaysZero();
  iutest::detail::iuFilePath::GetExtension_abi_cxx11_
            (&local_4c8,(iuFilePath *)&iutest_ar_2.m_result);
  iutest::internal::backward::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((AssertionResult *)local_4a8,(EqHelper<false> *)"\".txt\"","path.GetExtension()",".txt"
             ,(char (*) [5])&local_4c8,in_R9);
  std::__cxx11::string::~string((string *)&local_4c8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar1) {
    memset(&local_650,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_650);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_4a8);
    iutest::AssertionHelper::AssertionHelper
              (&local_680,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0x9f,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_680,&local_650);
    iutest::AssertionHelper::~AssertionHelper(&local_680);
    iutest::AssertionHelper::Fixed::~Fixed(&local_650);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  iutest::detail::iuFilePath::~iuFilePath((iuFilePath *)&iutest_ar_2.m_result);
  return;
}

Assistant:

IUTEST(FilePath, GetExtention)
{
    {
        ::iutest::internal::FilePath path;
        IUTEST_EXPECT_EQ("", path.GetExtension());
    }
    {
        ::iutest::internal::FilePath path("test.exe");
        IUTEST_EXPECT_EQ(".exe", path.GetExtension());
    }
    {
        ::iutest::internal::FilePath path("test.exe.txt");
        IUTEST_EXPECT_EQ(".txt", path.GetExtension());
    }
}